

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

void Rtm_ObjTransferToBig(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = *(uint *)pEdge;
  if ((uVar2 & 0xfff) == 10) {
    iVar3 = p->nExtraCur;
    if (iVar3 < p->nExtraAlloc) {
      puVar1 = p->pExtra;
    }
    else {
      uVar2 = p->nExtraAlloc * 2;
      uVar4 = 0x400;
      if (0x400 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      if (p->pExtra == (uint *)0x0) {
        puVar1 = (uint *)malloc(uVar4 * 4);
      }
      else {
        puVar1 = (uint *)realloc(p->pExtra,uVar4 * 4);
        iVar3 = p->nExtraCur;
      }
      p->pExtra = puVar1;
      p->nExtraAlloc = (int)uVar4;
      uVar2 = *(uint *)pEdge;
    }
    puVar1[iVar3] = uVar2 >> 0xc;
    iVar3 = p->nExtraCur;
    p->nExtraCur = iVar3 + 1;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | iVar3 << 0xc;
    return;
  }
  __assert_fail("pEdge->nLats == 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                ,0xb0,"void Rtm_ObjTransferToBig(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBig( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    assert( pEdge->nLats == 10 );
    if ( p->nExtraCur + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    p->pExtra[p->nExtraCur] = pEdge->LData;
    pEdge->LData = p->nExtraCur++;
}